

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extralev.c
# Opt level: O0

void roguejoin(level *lev,int x1,int y1,int x2,int y2,int horiz)

{
  int iVar1;
  int local_80;
  int local_78;
  int local_74;
  int local_6c;
  int local_68;
  int local_60;
  int local_58;
  int local_50;
  int local_4c;
  int local_44;
  int local_40;
  int local_38;
  int local_2c;
  int middle;
  int y;
  int x;
  int horiz_local;
  int y2_local;
  int x2_local;
  int y1_local;
  int x1_local;
  level *lev_local;
  
  if (horiz == 0) {
    iVar1 = rn2((y2 - y1) + 1);
    iVar1 = y1 + iVar1;
    local_60 = iVar1;
    if (y1 < iVar1) {
      local_60 = y1;
    }
    local_2c = local_60;
    while( true ) {
      local_68 = iVar1;
      if (iVar1 < y1) {
        local_68 = y1;
      }
      if (local_68 < local_2c) break;
      corr(lev,x1,local_2c);
      local_2c = local_2c + 1;
    }
    local_6c = x2;
    if (x1 < x2) {
      local_6c = x1;
    }
    middle = local_6c;
    while( true ) {
      local_74 = x2;
      if (x2 < x1) {
        local_74 = x1;
      }
      if (local_74 < middle) break;
      corr(lev,middle,iVar1);
      middle = middle + 1;
    }
    local_78 = y2;
    if (iVar1 < y2) {
      local_78 = iVar1;
    }
    local_2c = local_78;
    while( true ) {
      local_80 = y2;
      if (y2 < iVar1) {
        local_80 = iVar1;
      }
      if (local_80 < local_2c) break;
      corr(lev,x2,local_2c);
      local_2c = local_2c + 1;
    }
  }
  else {
    iVar1 = rn2((x2 - x1) + 1);
    iVar1 = x1 + iVar1;
    local_38 = iVar1;
    if (x1 < iVar1) {
      local_38 = x1;
    }
    middle = local_38;
    while( true ) {
      local_40 = iVar1;
      if (iVar1 < x1) {
        local_40 = x1;
      }
      if (local_40 < middle) break;
      corr(lev,middle,y1);
      middle = middle + 1;
    }
    local_44 = y2;
    if (y1 < y2) {
      local_44 = y1;
    }
    local_2c = local_44;
    while( true ) {
      local_4c = y2;
      if (y2 < y1) {
        local_4c = y1;
      }
      if (local_4c < local_2c) break;
      corr(lev,iVar1,local_2c);
      local_2c = local_2c + 1;
    }
    local_50 = x2;
    if (iVar1 < x2) {
      local_50 = iVar1;
    }
    middle = local_50;
    while( true ) {
      local_58 = x2;
      if (x2 < iVar1) {
        local_58 = iVar1;
      }
      if (local_58 < middle) break;
      corr(lev,middle,y2);
      middle = middle + 1;
    }
  }
  return;
}

Assistant:

static void roguejoin(struct level *lev, int x1, int y1, int x2, int y2, int horiz)
{
	int x,y,middle;
#ifndef MAX
#define MAX(a,b) (((a) > (b)) ? (a) : (b))
#endif
#ifndef MIN
#define MIN(a,b) (((a) < (b)) ? (a) : (b))
#endif
	if (horiz) {
		middle = x1 + rn2(x2-x1+1);
		for (x=MIN(x1,middle); x<=MAX(x1,middle); x++)
			corr(lev, x, y1);
		for (y=MIN(y1,y2); y<=MAX(y1,y2); y++)
			corr(lev, middle,y);
		for (x=MIN(middle,x2); x<=MAX(middle,x2); x++)
			corr(lev, x, y2);
	} else {
		middle = y1 + rn2(y2-y1+1);
		for (y=MIN(y1,middle); y<=MAX(y1,middle); y++)
			corr(lev, x1, y);
		for (x=MIN(x1,x2); x<=MAX(x1,x2); x++)
			corr(lev, x, middle);
		for (y=MIN(middle,y2); y<=MAX(middle,y2); y++)
			corr(lev, x2,y);
	}
}